

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkRestrash(Abc_Ntk_t *pNtk,int fCleanup)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  long lVar6;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar3 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar3 != 0) {
      puts("Warning: The choice nodes in the original AIG are removed by strashing.");
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    __ptr = Abc_NtkDfs(pNtk,0);
    if (0 < __ptr->nSize) {
      lVar6 = 0;
      do {
        plVar1 = (long *)__ptr->pArray[lVar6];
        lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
        pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 0xb & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40)));
        plVar1[8] = (long)pAVar4;
        lVar6 = lVar6 + 1;
      } while (lVar6 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    if (fCleanup != 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar5 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar5;
    }
    iVar3 = Abc_NtkCheck(pNtkNew);
    if (iVar3 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x38,"Abc_Ntk_t *Abc_NtkRestrash(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrash( Abc_Ntk_t * pNtk, int fCleanup )
{
//    extern int timeRetime;
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    assert( Abc_NtkIsStrash(pNtk) );
//timeRetime = Abc_Clock();
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // print warning about self-feed latches
//    if ( Abc_NtkCountSelfFeedLatches(pNtkAig) )
//        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtkAig) );
    // perform cleanup if requested
    if ( fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
    {
//        printf( "Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    }
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//timeRetime = Abc_Clock() - timeRetime;
//    if ( RetValue = Abc_NtkRemoveSelfFeedLatches(pNtkAig) )
//        printf( "Modified %d self-feeding latches. The result may not verify.\n", RetValue );
    return pNtkAig;

}